

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O0

void usage(void)

{
  puts(
      "Tool to compute an intermediate block\n\nReads a set of input symbols from stdin and writes a\ngenerated intermediate block to stdout\n\n   -h       Display help screen and exit\n\n   -m <m>   Set operating mode, can be either:\n             iblock:  generate intermediate block from\n                      input symbols [default]\n             iosym:   generate code symbols from\n                      intermediate block\n   -K #     Set code dimension\n   -T #     Set symbol size\n   -i #,... Set symbol identifiers of symbols\n              iblock mode: ESIs of input symbols\n              iosym mode: ESIs of symbols to generate\n"
      );
  return;
}

Assistant:

static void usage()
{
	puts(	"Tool to compute an intermediate block\n"
	        "\n"
		"Reads a set of input symbols from stdin and writes a\n"
		"generated intermediate block to stdout\n"
		"\n"
		"   -h       Display help screen and exit\n"
		"\n"
		"   -m <m>   Set operating mode, can be either:\n"
		"             iblock:  generate intermediate block from\n"
		"                      input symbols [default]\n"
		"             iosym:   generate code symbols from\n"
		"                      intermediate block\n"
		"   -K #     Set code dimension\n"
		"   -T #     Set symbol size\n"
		"   -i #,... Set symbol identifiers of symbols\n"
		"              iblock mode: ESIs of input symbols\n"
		"              iosym mode: ESIs of symbols to generate\n"
	);
}